

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WScriptJsrt.cpp
# Opt level: O0

HRESULT __thiscall WScriptJsrt::CallbackMessage::CallFunction(CallbackMessage *this,LPCSTR fileName)

{
  JsErrorCode JVar1;
  JsValueRef local_48;
  JsValueRef fname;
  JsErrorCode errorCode;
  JsValueType type;
  JsValueRef stringValue;
  JsValueRef result;
  JsValueRef global;
  LPCSTR pCStack_18;
  HRESULT hr;
  LPCSTR fileName_local;
  CallbackMessage *this_local;
  
  global._4_4_ = 0;
  fname._0_4_ = 0;
  pCStack_18 = fileName;
  fileName_local = (LPCSTR)this;
  JVar1 = ChakraRTInterface::JsGetGlobalObject(&result);
  if (JVar1 == JsNoError) {
    JVar1 = ChakraRTInterface::JsGetValueType(this->m_function,(JsValueType *)((long)&fname + 4));
    if (JVar1 == JsNoError) {
      if (fname._4_4_ == 3) {
        JVar1 = ChakraRTInterface::JsConvertValueToString(this->m_function,(JsValueRef *)&errorCode)
        ;
        if (JVar1 != JsNoError) {
          return -0x7fffbffb;
        }
        ChakraRTInterface::JsCreateString("",0,&local_48);
        fname._0_4_ = ChakraRTInterface::JsRun
                                (_errorCode,0xffffffffffffffff,local_48,
                                 JsParseScriptAttributeArrayBufferIsUtf16Encoded,(JsValueRef *)0x0);
      }
      else {
        fname._0_4_ = ChakraRTInterface::JsCallFunction(this->m_function,&result,1,&stringValue);
      }
      if ((JsErrorCode)fname != JsNoError) {
        global._4_4_ = -0x7fffbffb;
        PrintException(pCStack_18,(JsErrorCode)fname,(JsValueRef)0x0);
      }
    }
    else {
      global._4_4_ = -0x7fffbffb;
    }
  }
  else {
    global._4_4_ = -0x7fffbffb;
  }
  return global._4_4_;
}

Assistant:

HRESULT WScriptJsrt::CallbackMessage::CallFunction(LPCSTR fileName)
{
    HRESULT hr = S_OK;

    JsValueRef global;
    JsValueRef result;
    JsValueRef stringValue;
    JsValueType type;
    JsErrorCode errorCode = JsNoError;

    IfJsrtErrorHR(ChakraRTInterface::JsGetGlobalObject(&global));
    IfJsrtErrorHR(ChakraRTInterface::JsGetValueType(m_function, &type));

    if (type == JsString)
    {
        IfJsrtErrorHR(ChakraRTInterface::JsConvertValueToString(m_function, &stringValue));

        JsValueRef fname;
        ChakraRTInterface::JsCreateString("", strlen(""), &fname);
        // Run the code
        errorCode = ChakraRTInterface::JsRun(stringValue, JS_SOURCE_CONTEXT_NONE,
          fname, JsParseScriptAttributeArrayBufferIsUtf16Encoded,
          nullptr /*no result needed*/);
    }
    else
    {
        errorCode = ChakraRTInterface::JsCallFunction(m_function, &global, 1, &result);
    }

    if (errorCode != JsNoError)
    {
        hr = E_FAIL;
        PrintException(fileName, errorCode);
    }

Error:
    return hr;
}